

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

index_t GEO::Process::number_of_cores(void)

{
  if (number_of_cores::result != 0) {
    return number_of_cores::result;
  }
  number_of_cores::result = os_number_of_cores();
  return number_of_cores::result;
}

Assistant:

index_t number_of_cores() {
            static index_t result = 0;
            if(result == 0) {
#ifdef GEO_NO_THREAD_LOCAL
		// Deactivate multithreading if thread_local is
		// not supported (e.g. with old OS-X).
		result = 1;
#else		
                result = os_number_of_cores();
#endif		
            }
            return result;
        }